

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::readConstructionData
          (GridLocalPolynomial *this,istream *is,bool iomode)

{
  unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
  local_38 [2];
  unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
  local_28;
  undefined1 local_19;
  istream *piStack_18;
  bool iomode_local;
  istream *is_local;
  GridLocalPolynomial *this_local;
  
  local_19 = iomode;
  piStack_18 = is;
  is_local = (istream *)this;
  if (iomode) {
    Utils::
    make_unique<TasGrid::SimpleConstructData,std::istream&,int&,int&,TasGrid::IO::mode_binary_type>
              ((basic_istream<char,_std::char_traits<char>_> *)local_38,(int *)is,
               &(this->super_BaseCanonicalGrid).num_dimensions,
               (mode_binary_type *)&(this->super_BaseCanonicalGrid).num_outputs);
    ::std::
    unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>::
    operator=((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
               *)&this->dynamic_values,local_38);
    ::std::
    unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>::
    ~unique_ptr(local_38);
  }
  else {
    Utils::
    make_unique<TasGrid::SimpleConstructData,std::istream&,int&,int&,TasGrid::IO::mode_ascii_type>
              ((basic_istream<char,_std::char_traits<char>_> *)&local_28,(int *)is,
               &(this->super_BaseCanonicalGrid).num_dimensions,
               (mode_ascii_type *)&(this->super_BaseCanonicalGrid).num_outputs);
    ::std::
    unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>::
    operator=((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
               *)&this->dynamic_values,&local_28);
    ::std::
    unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>::
    ~unique_ptr(&local_28);
  }
  return;
}

Assistant:

void GridLocalPolynomial::readConstructionData(std::istream &is, bool iomode){
    if (iomode == mode_ascii)
        dynamic_values = Utils::make_unique<SimpleConstructData>(is, num_dimensions, num_outputs, IO::mode_ascii_type());
    else
        dynamic_values = Utils::make_unique<SimpleConstructData>(is, num_dimensions, num_outputs, IO::mode_binary_type());
}